

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     ConstantOperation<int,duckdb::QuantileState<int,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<int>>
               (QuantileState<int,_duckdb::QuantileStandardType> *state,int *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  QuantileState<int,_duckdb::QuantileStandardType> *in_RCX;
  idx_t i;
  QuantileState<int,_duckdb::QuantileStandardType> *input_00;
  
  for (input_00 = (QuantileState<int,_duckdb::QuantileStandardType> *)0x0; input_00 < in_RCX;
      input_00 = (QuantileState<int,_duckdb::QuantileStandardType> *)
                 ((long)&(input_00->v).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    Operation<int,duckdb::QuantileState<int,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<int>>
              (in_RCX,(int *)input_00,(AggregateUnaryInput *)0xad40ef);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}